

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.h
# Opt level: O0

string * __thiscall
flatbuffers::Namer::Denamespace
          (string *__return_storage_ptr__,Namer *this,string *s,string *namespace_prefix,
          char delimiter)

{
  string local_58 [32];
  long local_38;
  size_t pos;
  string *psStack_28;
  char delimiter_local;
  string *namespace_prefix_local;
  string *s_local;
  Namer *this_local;
  
  pos._7_1_ = delimiter;
  psStack_28 = namespace_prefix;
  namespace_prefix_local = s;
  s_local = (string *)this;
  this_local = (Namer *)__return_storage_ptr__;
  local_38 = std::__cxx11::string::find_last_of((char)s,(ulong)(uint)(int)delimiter);
  if (local_38 == -1) {
    std::__cxx11::string::operator=((string *)psStack_28,"");
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)namespace_prefix_local);
  }
  else {
    std::__cxx11::string::substr((ulong)local_58,(ulong)namespace_prefix_local);
    std::__cxx11::string::operator=((string *)psStack_28,local_58);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)namespace_prefix_local);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Denamespace(const std::string &s,
                                  std::string &namespace_prefix,
                                  const char delimiter = '.') const {
    const size_t pos = s.find_last_of(delimiter);
    if (pos == std::string::npos) {
      namespace_prefix = "";
      return s;
    }
    namespace_prefix = s.substr(0, pos);
    return s.substr(pos + 1);
  }